

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  STB_TexteditState *state;
  float fVar1;
  uchar uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  int iVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  unsigned_short *puVar8;
  float fVar9;
  StbUndoRecord *pSVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  StbFindState *pSVar14;
  ImWchar *pIVar15;
  ulong uVar16;
  short sVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  int *piVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  float fVar27;
  StbFindState find;
  StbTexteditRow row;
  
  state = &this->Stb;
  uVar2 = (this->Stb).single_line;
LAB_00176bb7:
  switch(key) {
  case 0x200000:
    goto switchD_00176bca_caseD_200000;
  case 0x200001:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      state->cursor = state->cursor + 1;
    }
    else {
      ImStb::stb_textedit_move_to_last(this,state);
    }
    ImStb::stb_textedit_clamp(this,state);
    goto LAB_001774bf;
  case 0x200002:
switchD_00176bca_caseD_200002:
    if (uVar2 == '\0') {
      if ((key & 0x400000U) == 0) {
        if ((this->Stb).select_start != (this->Stb).select_end) {
          ImStb::stb_textedit_move_to_first(state);
        }
      }
      else {
        ImStb::stb_textedit_prep_selection_at_cursor(state);
      }
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_find_charpos(&find,this,(this->Stb).cursor,(uint)(this->Stb).single_line);
      if (find.prev_first == find.first_char) goto LAB_001774c3;
      pSVar14 = (StbFindState *)&(this->Stb).preferred_x;
      if ((this->Stb).has_preferred_x == '\0') {
        pSVar14 = &find;
      }
      fVar1 = pSVar14->x;
      (this->Stb).cursor = find.prev_first;
      ImStb::STB_TEXTEDIT_LAYOUTROW(&row,this,find.prev_first);
      iVar12 = 0;
      if (row.num_chars < 1) {
        row.num_chars = 0;
      }
      iVar25 = (this->Stb).cursor;
      fVar9 = row.x0;
      goto LAB_0017717c;
    }
    key = key & 0x400000U | 0x200000;
    goto LAB_00176bb7;
  case 0x200003:
switchD_00176bca_caseD_200003:
    if (uVar2 != '\0') goto code_r0x00176c08;
    if ((key & 0x400000U) == 0) {
      if ((this->Stb).select_start != (this->Stb).select_end) {
        ImStb::stb_textedit_move_to_last(this,state);
      }
    }
    else {
      ImStb::stb_textedit_prep_selection_at_cursor(state);
    }
    ImStb::stb_textedit_clamp(this,state);
    ImStb::stb_textedit_find_charpos(&find,this,(this->Stb).cursor,(uint)(this->Stb).single_line);
    if (find.length == 0) goto LAB_001774c3;
    pSVar14 = (StbFindState *)&(this->Stb).preferred_x;
    if ((this->Stb).has_preferred_x == '\0') {
      pSVar14 = &find;
    }
    fVar1 = pSVar14->x;
    iVar12 = find.length + find.first_char;
    (this->Stb).cursor = iVar12;
    ImStb::STB_TEXTEDIT_LAYOUTROW(&row,this,iVar12);
    iVar25 = 0;
    if (row.num_chars < 1) {
      row.num_chars = 0;
    }
    iVar5 = (this->Stb).cursor;
    fVar9 = row.x0;
    goto LAB_001770aa;
  case 0x200004:
    ImStb::stb_textedit_clamp(this,state);
    ImStb::stb_textedit_move_to_first(state);
    if ((this->Stb).single_line == '\0') {
      iVar12 = (this->Stb).cursor;
      puVar8 = (this->TextW).Data;
      while ((0 < iVar12 && (puVar8[iVar12 - 1] != 10))) {
        iVar12 = iVar12 + -1;
        state->cursor = iVar12;
      }
    }
    else {
      state->cursor = 0;
    }
    goto LAB_001774bf;
  case 0x200005:
    iVar12 = this->CurLenW;
    ImStb::stb_textedit_clamp(this,state);
    ImStb::stb_textedit_move_to_first(state);
    if ((this->Stb).single_line == '\0') {
      iVar25 = (this->Stb).cursor;
      puVar8 = (this->TextW).Data;
      for (lVar20 = (long)iVar25; (iVar25 = iVar25 + 1, lVar20 < iVar12 && (puVar8[lVar20] != 10));
          lVar20 = lVar20 + 1) {
        state->cursor = iVar25;
      }
    }
    else {
      state->cursor = iVar12;
    }
    goto LAB_001774bf;
  case 0x200006:
    (this->Stb).select_end = 0;
    (this->Stb).cursor = 0;
    (this->Stb).select_start = 0;
    goto LAB_001774bf;
  case 0x200007:
    (this->Stb).cursor = this->CurLenW;
    (this->Stb).select_start = 0;
    (this->Stb).select_end = 0;
    goto LAB_001774bf;
  case 0x200008:
switchD_00176bca_caseD_200008:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar12 = (this->Stb).cursor;
      if (iVar12 < this->CurLenW) {
        ImStb::stb_textedit_delete(this,state,iVar12,1);
      }
      goto LAB_001774bf;
    }
    break;
  case 0x200009:
switchD_00176bca_caseD_200009:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      ImStb::stb_textedit_clamp(this,state);
      iVar12 = (this->Stb).cursor;
      if (0 < iVar12) {
        ImStb::stb_textedit_delete(this,state,iVar12 + -1,1);
        (this->Stb).cursor = (this->Stb).cursor + -1;
      }
      goto LAB_001774bf;
    }
    break;
  case 0x20000a:
    lVar20 = (long)(this->Stb).undostate.undo_point;
    if (lVar20 != 0) {
      iVar12 = (this->Stb).undostate.undo_rec[lVar20 + -1].where;
      iVar25 = (this->Stb).undostate.undo_rec[lVar20 + -1].insert_length;
      uVar18 = (this->Stb).undostate.undo_rec[lVar20 + -1].delete_length;
      iVar5 = (this->Stb).undostate.undo_rec[lVar20 + -1].char_storage;
      uVar16 = (ulong)(this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_rec[uVar16 - 1].char_storage = -1;
      (this->Stb).undostate.undo_rec[uVar16 - 1].insert_length = uVar18;
      (this->Stb).undostate.undo_rec[uVar16 - 1].delete_length = iVar25;
      (this->Stb).undostate.undo_rec[uVar16 - 1].where = iVar12;
      if ((long)(int)uVar18 != 0) {
        iVar26 = (this->Stb).undostate.undo_char_point;
        if ((int)(iVar26 + uVar18) < 999) {
          do {
            iVar23 = (this->Stb).undostate.redo_char_point;
            do {
              sVar17 = (short)uVar16;
              lVar20 = (long)sVar17;
              if ((int)(iVar26 + uVar18) <= iVar23) {
                (this->Stb).undostate.undo_rec[lVar20 + -1].char_storage = iVar23 - uVar18;
                uVar16 = 0;
                uVar22 = 0;
                if (0 < (int)uVar18) {
                  uVar22 = (ulong)uVar18;
                }
                (this->Stb).undostate.redo_char_point = iVar23 - uVar18;
                puVar8 = (this->TextW).Data;
                for (; uVar22 != uVar16; uVar16 = uVar16 + 1) {
                  *(unsigned_short *)
                   ((long)this + uVar16 * 2 + (long)iVar23 * 2 + (long)(int)uVar18 * -2 + 0x694) =
                       puVar8[(long)iVar12 + uVar16];
                }
                goto LAB_00176fc5;
              }
              if (sVar17 == 99) goto LAB_001774bf;
            } while (0x62 < sVar17);
            if (-1 < (this->Stb).undostate.undo_rec[0x62].char_storage) {
              iVar26 = (this->Stb).undostate.undo_rec[0x62].insert_length;
              iVar23 = iVar23 + iVar26;
              (this->Stb).undostate.redo_char_point = iVar23;
              pIVar15 = (this->Stb).undostate.undo_char + iVar23;
              memmove(pIVar15,pIVar15 + -(long)iVar26,(long)(999 - iVar23) * 2);
              lVar20 = (long)(this->Stb).undostate.redo_point;
              piVar21 = &(this->Stb).undostate.undo_rec[lVar20].char_storage;
              for (lVar24 = lVar20; lVar24 < 0x62; lVar24 = lVar24 + 1) {
                if (-1 < *piVar21) {
                  *piVar21 = *piVar21 + iVar26;
                }
                piVar21 = piVar21 + 4;
              }
            }
            memmove((this->Stb).undostate.undo_rec + lVar20 + 1,
                    (this->Stb).undostate.undo_rec + lVar20,lVar20 * -0x10 + 0x620);
            iVar26 = (this->Stb).undostate.undo_char_point;
            uVar19 = *(int *)&(this->Stb).undostate.redo_point + 1;
            uVar16 = (ulong)uVar19;
            (this->Stb).undostate.redo_point = (short)uVar19;
          } while( true );
        }
        (this->Stb).undostate.undo_rec[uVar16 - 1].insert_length = 0;
LAB_00176fc5:
        ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar12,uVar18);
      }
      if (iVar25 != 0) {
        ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar12,(this->Stb).undostate.undo_char + iVar5,iVar25);
        piVar21 = &(this->Stb).undostate.undo_char_point;
        *piVar21 = *piVar21 - iVar25;
      }
      (this->Stb).cursor = iVar25 + iVar12;
      uVar4 = (this->Stb).undostate.undo_point;
      uVar7 = (this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_point = uVar4 + -1;
      (this->Stb).undostate.redo_point = uVar7 + -1;
    }
    goto LAB_001774bf;
  case 0x20000b:
    lVar20 = (long)(this->Stb).undostate.redo_point;
    if (lVar20 != 99) {
      sVar17 = (this->Stb).undostate.undo_point;
      iVar12 = (this->Stb).undostate.undo_rec[lVar20].where;
      iVar25 = (this->Stb).undostate.undo_rec[lVar20].insert_length;
      uVar18 = (this->Stb).undostate.undo_rec[lVar20].delete_length;
      iVar5 = (this->Stb).undostate.undo_rec[lVar20].char_storage;
      (this->Stb).undostate.undo_rec[sVar17].delete_length = iVar25;
      (this->Stb).undostate.undo_rec[sVar17].insert_length = uVar18;
      (this->Stb).undostate.undo_rec[sVar17].where = iVar12;
      (this->Stb).undostate.undo_rec[sVar17].char_storage = -1;
      if (uVar18 != 0) {
        iVar26 = (this->Stb).undostate.undo_char_point;
        if ((this->Stb).undostate.redo_char_point < (int)(iVar26 + uVar18)) {
          pSVar10 = (this->Stb).undostate.undo_rec + sVar17;
          pSVar10->insert_length = 0;
          pSVar10->delete_length = 0;
        }
        else {
          (this->Stb).undostate.undo_rec[sVar17].char_storage = iVar26;
          (this->Stb).undostate.undo_char_point = iVar26 + uVar18;
          uVar16 = 0;
          uVar22 = 0;
          if (0 < (int)uVar18) {
            uVar22 = (ulong)uVar18;
          }
          puVar8 = (this->TextW).Data;
          for (; uVar22 != uVar16; uVar16 = uVar16 + 1) {
            (this->Stb).undostate.undo_char[(long)iVar26 + uVar16] = puVar8[(long)iVar12 + uVar16];
          }
        }
        ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar12,uVar18);
      }
      if (iVar25 != 0) {
        ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar12,(this->Stb).undostate.undo_char + iVar5,iVar25);
        piVar21 = &(this->Stb).undostate.redo_char_point;
        *piVar21 = *piVar21 + iVar25;
      }
      (this->Stb).cursor = iVar25 + iVar12;
      uVar3 = (this->Stb).undostate.undo_point;
      uVar6 = (this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_point = uVar3 + 1;
      (this->Stb).undostate.redo_point = uVar6 + 1;
    }
    goto LAB_001774bf;
  case 0x20000c:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar12 = ImStb::STB_TEXTEDIT_MOVEWORDLEFT_IMPL(this,(this->Stb).cursor);
      goto LAB_00176e22;
    }
    ImStb::stb_textedit_move_to_first(state);
    goto LAB_001774c3;
  case 0x20000d:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar12 = ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->Stb).cursor);
LAB_00176e22:
      (this->Stb).cursor = iVar12;
LAB_00176e25:
      ImStb::stb_textedit_clamp(this,state);
    }
    else {
      ImStb::stb_textedit_move_to_last(this,state);
    }
    goto LAB_001774c3;
  default:
    switch(key) {
    case 0x600000:
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      iVar12 = (this->Stb).select_end;
      if (0 < iVar12) {
        iVar12 = iVar12 + -1;
        goto LAB_00176d4e;
      }
      break;
    case 0x600001:
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      piVar21 = &(this->Stb).select_end;
      *piVar21 = *piVar21 + 1;
      ImStb::stb_textedit_clamp(this,state);
      iVar12 = (this->Stb).select_end;
      break;
    case 0x600002:
      goto switchD_00176bca_caseD_200002;
    case 0x600003:
      goto switchD_00176bca_caseD_200003;
    case 0x600004:
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      if ((this->Stb).single_line == '\0') {
        uVar19 = (this->Stb).cursor;
        puVar8 = (this->TextW).Data;
        uVar13 = (int)uVar19 >> 0x1f & uVar19;
        while ((uVar18 = uVar13, 0 < (int)uVar19 && (uVar18 = uVar19, puVar8[uVar19 - 1] != 10))) {
          uVar19 = uVar19 - 1;
          state->cursor = uVar19;
        }
      }
      else {
        state->cursor = 0;
        uVar18 = 0;
      }
      (this->Stb).select_end = uVar18;
      goto LAB_001774bf;
    case 0x600005:
      iVar12 = this->CurLenW;
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      if ((this->Stb).single_line == '\0') {
        lVar24 = (long)iVar12;
        iVar25 = (this->Stb).cursor;
        lVar20 = (long)iVar25;
        puVar8 = (this->TextW).Data;
        if (lVar24 < lVar20) {
          iVar12 = iVar25;
        }
        goto LAB_0017731c;
      }
      state->cursor = iVar12;
      goto LAB_001774bb;
    case 0x600006:
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      (this->Stb).select_end = 0;
      (this->Stb).cursor = 0;
      goto LAB_001774bf;
    case 0x600007:
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      iVar12 = this->CurLenW;
LAB_00176d4e:
      (this->Stb).select_end = iVar12;
      break;
    case 0x600008:
      goto switchD_00176bca_caseD_200008;
    case 0x600009:
      goto switchD_00176bca_caseD_200009;
    default:
      uVar18 = 0;
      if (key < 0x200000) {
        uVar18 = key;
      }
      if (((int)uVar18 < 1) || (find.x._0_2_ = (undefined2)uVar18, uVar18 == 10 && uVar2 != '\0'))
      goto LAB_001774c3;
      if (((this->Stb).insert_mode == '\0') || ((this->Stb).select_start != (this->Stb).select_end))
      {
LAB_0017738b:
        ImStb::stb_textedit_delete_selection(this,state);
        bVar11 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,(ImWchar *)&find,1);
        if (!bVar11) goto LAB_001774c3;
        ImStb::stb_text_makeundo_insert(state,state->cursor,1);
      }
      else {
        iVar12 = (this->Stb).cursor;
        if (this->CurLenW <= iVar12) goto LAB_0017738b;
        pIVar15 = ImStb::stb_text_createundo(&(this->Stb).undostate,iVar12,1,1);
        if (pIVar15 != (ImWchar *)0x0) {
          *pIVar15 = (this->TextW).Data[iVar12];
        }
        ImStb::STB_TEXTEDIT_DELETECHARS(this,(this->Stb).cursor,1);
        bVar11 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,(ImWchar *)&find,1);
        if (!bVar11) goto LAB_001774c3;
      }
      (this->Stb).cursor = (this->Stb).cursor + 1;
      goto LAB_001774bf;
    case 0x60000c:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        ImStb::stb_textedit_prep_selection_at_cursor(state);
      }
      iVar12 = ImStb::STB_TEXTEDIT_MOVEWORDLEFT_IMPL(this,(this->Stb).cursor);
      goto LAB_00176d89;
    case 0x60000d:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        ImStb::stb_textedit_prep_selection_at_cursor(state);
      }
      iVar12 = ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->Stb).cursor);
LAB_00176d89:
      (this->Stb).cursor = iVar12;
      (this->Stb).select_end = iVar12;
      goto LAB_00176e25;
    }
    (this->Stb).cursor = iVar12;
    goto LAB_001774bf;
  }
  ImStb::stb_textedit_delete_selection(this,state);
  goto LAB_001774bf;
LAB_0017731c:
  iVar25 = iVar25 + 1;
  if (lVar24 <= lVar20) goto LAB_001774bb;
  if (puVar8[lVar20] == 10) {
    iVar12 = (int)lVar20;
    goto LAB_001774bb;
  }
  lVar20 = lVar20 + 1;
  state->cursor = iVar25;
  goto LAB_0017731c;
LAB_001774bb:
  (this->Stb).select_end = iVar12;
  goto LAB_001774bf;
code_r0x00176c08:
  key = key & 0x400000U | 0x200001;
  goto LAB_00176bb7;
LAB_001770aa:
  if (row.num_chars == iVar25) goto LAB_001771bf;
  fVar27 = ImStb::STB_TEXTEDIT_GETWIDTH(this,iVar12,iVar25);
  if (((fVar27 == -1.0) && (!NAN(fVar27))) || (fVar9 = fVar9 + fVar27, fVar1 < fVar9))
  goto LAB_001771bf;
  state->cursor = iVar5 + 1 + iVar25;
  iVar25 = iVar25 + 1;
  goto LAB_001770aa;
LAB_0017717c:
  if (row.num_chars == iVar12) goto LAB_001771bf;
  fVar27 = ImStb::STB_TEXTEDIT_GETWIDTH(this,find.prev_first,iVar12);
  if (((fVar27 == -1.0) && (!NAN(fVar27))) || (fVar9 = fVar9 + fVar27, fVar1 < fVar9))
  goto LAB_001771bf;
  state->cursor = iVar25 + 1 + iVar12;
  iVar12 = iVar12 + 1;
  goto LAB_0017717c;
LAB_001771bf:
  ImStb::stb_textedit_clamp(this,state);
  (this->Stb).has_preferred_x = '\x01';
  (this->Stb).preferred_x = fVar1;
  if ((key & 0x400000U) != 0) {
    (this->Stb).select_end = (this->Stb).cursor;
  }
  goto LAB_001774c3;
switchD_00176bca_caseD_200000:
  if ((this->Stb).select_start == (this->Stb).select_end) {
    if (0 < state->cursor) {
      state->cursor = state->cursor + -1;
    }
  }
  else {
    ImStb::stb_textedit_move_to_first(state);
  }
LAB_001774bf:
  (this->Stb).has_preferred_x = '\0';
LAB_001774c3:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &Stb, key);
    CursorFollow = true;
    CursorAnimReset();
}